

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thpool.c
# Opt level: O2

int thpool_add_work(thpool_ *thpool_p,_func_void_void_ptr *function_p,void *arg_p)

{
  int iVar1;
  job *pjVar2;
  
  pjVar2 = (job *)malloc(0x18);
  if (pjVar2 == (job *)0x0) {
    fwrite("thpool_add_work(): Could not allocate memory for new job\n",0x39,1,_stderr);
    iVar1 = -1;
  }
  else {
    pjVar2->function = function_p;
    pjVar2->arg = arg_p;
    pthread_mutex_lock((pthread_mutex_t *)&thpool_p->jobqueue);
    pjVar2->prev = (job *)0x0;
    iVar1 = (thpool_p->jobqueue).len;
    if (iVar1 == 0) {
      (thpool_p->jobqueue).front = pjVar2;
    }
    else {
      ((thpool_p->jobqueue).rear)->prev = pjVar2;
    }
    (thpool_p->jobqueue).rear = pjVar2;
    (thpool_p->jobqueue).len = iVar1 + 1;
    bsem_post((thpool_p->jobqueue).has_jobs);
    pthread_mutex_unlock((pthread_mutex_t *)&thpool_p->jobqueue);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int thpool_add_work(thpool_* thpool_p, void (*function_p)(void*), void* arg_p){
	job* newjob;

	newjob=(struct job*)malloc(sizeof(struct job));
	if (newjob==NULL){
		err("thpool_add_work(): Could not allocate memory for new job\n");
		return -1;
	}

	/* add function and argument */
	newjob->function=function_p;
	newjob->arg=arg_p;

	/* add job to queue */
	jobqueue_push(&thpool_p->jobqueue, newjob);

	return 0;
}